

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdial.cpp
# Opt level: O2

void QDial::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  double *pdVar4;
  
  if (_c == WriteProperty) {
    pdVar4 = (double *)*_a;
    if (_id != 3) {
      if (_id == 2) {
        setNotchTarget((QDial *)_o,*pdVar4);
        return;
      }
      if (_id != 0) {
        return;
      }
      goto LAB_003c7401;
    }
  }
  else {
    if (_c == ReadProperty) {
      if ((uint)_id < 4) {
        pbVar1 = (byte *)*_a;
        switch(_id) {
        case 0:
          bVar2 = *(byte *)(*(long *)(_o + 8) + 0x298) >> 1;
          break;
        case 1:
          iVar3 = notchSize((QDial *)_o);
          *(int *)pbVar1 = iVar3;
          return;
        case 2:
          *(undefined8 *)pbVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x290);
          return;
        case 3:
          bVar2 = *(byte *)(*(long *)(_o + 8) + 0x298);
        }
        *pbVar1 = bVar2 & 1;
        return;
      }
      return;
    }
    if (_c != InvokeMetaMethod) {
      return;
    }
    if (_id == 1) {
      pdVar4 = (double *)_a[1];
LAB_003c7401:
      setWrapping((QDial *)_o,*(bool *)pdVar4);
      return;
    }
    if (_id != 0) {
      return;
    }
    pdVar4 = (double *)_a[1];
  }
  setNotchesVisible((QDial *)_o,*(bool *)pdVar4);
  return;
}

Assistant:

void QDial::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDial *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->setNotchesVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setWrapping((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->notchSize(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->notchTarget(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->notchesVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNotchTarget(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setNotchesVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}